

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::ReadableDirectory,_std::nullptr_t> __thiscall
kj::ReadableDirectory::openSubdir(ReadableDirectory *this,PathPtr path)

{
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar1;
  Clock *clock;
  InMemoryFileFactory *fileFactory;
  undefined8 in_RCX;
  ReadableDirectory *extraout_RDX;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> OVar2;
  undefined1 local_90 [24];
  Fault f;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *dir;
  undefined1 local_38 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _dir561;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  this_local = (ReadableDirectory *)path.parts.size_;
  _dir561.value.ptr = (ReadableDirectory *)path.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  (**(code **)((((String *)_dir561.value.ptr)->content).ptr + 0x58))
            ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)
             &stack0xffffffffffffffb8,_dir561.value.ptr,this_local,in_RCX);
  kj::_::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
            ((_ *)local_38,
             (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)
             &stack0xffffffffffffffb8);
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)
             &stack0xffffffffffffffb8);
  pOVar1 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar1 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],kj::PathPtr&>
              ((Fault *)(local_90 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x234,FAILED,(char *)0x0,"\"no such directory\", path",
               (char (*) [18])"no such directory",(PathPtr *)&this_local);
    f.exception._4_4_ = 2;
    kj::_::Debug::Fault::~Fault((Fault *)(local_90 + 0x10));
    clock = nullClock();
    fileFactory = defaultInMemoryFileFactory();
    newInMemoryDirectory((kj *)local_90,clock,fileFactory);
    Own<kj::ReadableDirectory_const,decltype(nullptr)>::Own<kj::Directory,void>
              ((Own<kj::ReadableDirectory_const,decltype(nullptr)> *)this,
               (Own<kj::Directory,_std::nullptr_t> *)local_90);
    Own<kj::Directory,_std::nullptr_t>::~Own((Own<kj::Directory,_std::nullptr_t> *)local_90);
  }
  else {
    pOVar1 = kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                       ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_38);
    pOVar1 = mv<kj::Own<kj::ReadableDirectory_const,decltype(nullptr)>>(pOVar1);
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::Own
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)this,pOVar1);
  }
  f.exception._4_4_ = 1;
  kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_38);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableDirectory> ReadableDirectory::openSubdir(PathPtr path) const {
  KJ_IF_SOME(dir, tryOpenSubdir(path)) {
    return kj::mv(dir);
  } else {
    KJ_FAIL_REQUIRE("no such directory", path) { break; }